

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

void rf_gfx_set_texture_filter(rf_texture2d texture,rf_texture_filter_mode filter_mode)

{
  float anisotropic_value;
  rf_texture_filter_mode filter_mode_local;
  
  (*(rf__ctx->field_0).gfx_ctx.gl.BindTexture)(0xde1,texture.id);
  switch(filter_mode) {
  case RF_FILTER_POINT:
    if (texture.mipmaps < 2) {
      (*(rf__ctx->field_0).gfx_ctx.gl.TexParameteri)(0xde1,0x2801,0x2600);
      (*(rf__ctx->field_0).gfx_ctx.gl.TexParameteri)(0xde1,0x2800,0x2600);
    }
    else {
      (*(rf__ctx->field_0).gfx_ctx.gl.TexParameteri)(0xde1,0x2801,0x2700);
      (*(rf__ctx->field_0).gfx_ctx.gl.TexParameteri)(0xde1,0x2800,0x2600);
    }
    break;
  case RF_FILTER_BILINEAR:
    if (texture.mipmaps < 2) {
      (*(rf__ctx->field_0).gfx_ctx.gl.TexParameteri)(0xde1,0x2801,0x2601);
      (*(rf__ctx->field_0).gfx_ctx.gl.TexParameteri)(0xde1,0x2800,0x2601);
    }
    else {
      (*(rf__ctx->field_0).gfx_ctx.gl.TexParameteri)(0xde1,0x2801,0x2701);
      (*(rf__ctx->field_0).gfx_ctx.gl.TexParameteri)(0xde1,0x2800,0x2601);
    }
    break;
  case RF_FILTER_TRILINEAR:
    if (texture.mipmaps < 2) {
      rf_log_impl(4,0x1b3c7d,(char *)(ulong)texture.id);
      (*(rf__ctx->field_0).gfx_ctx.gl.TexParameteri)(0xde1,0x2801,0x2601);
      (*(rf__ctx->field_0).gfx_ctx.gl.TexParameteri)(0xde1,0x2800,0x2601);
    }
    else {
      (*(rf__ctx->field_0).gfx_ctx.gl.TexParameteri)(0xde1,0x2801,0x2703);
      (*(rf__ctx->field_0).gfx_ctx.gl.TexParameteri)(0xde1,0x2800,0x2601);
    }
    break;
  case RF_FILTER_ANISOTROPIC_4x:
  case RF_FILTER_ANISOTROPIC_8x:
  case RF_FILTER_ANISOTROPIC_16x:
    if ((rf__ctx->field_0).gfx_ctx.extensions.max_anisotropic_level < 16.0) {
      if ((rf__ctx->field_0).gfx_ctx.extensions.max_anisotropic_level <= 0.0) {
        rf_log_impl(4,0x1b3d05);
      }
      else {
        rf_log_impl(4,0x1b3cc2,
                    (char *)(double)(rf__ctx->field_0).gfx_ctx.extensions.max_anisotropic_level,
                    (ulong)texture.id);
        (*(rf__ctx->field_0).gfx_ctx.gl.TexParameterf)(0xde1,0x84fe,16.0);
      }
    }
    else {
      (*(rf__ctx->field_0).gfx_ctx.gl.TexParameterf)(0xde1,0x84fe,16.0);
    }
  }
  (*(rf__ctx->field_0).gfx_ctx.gl.BindTexture)(0xde1,0);
  return;
}

Assistant:

RF_API void rf_gfx_set_texture_filter(rf_texture2d texture, rf_texture_filter_mode filter_mode)
{
    rf_gl.BindTexture(GL_TEXTURE_2D, texture.id);

    // Used only in case of anisotropic filters
    float anisotropic_value = 0;

    switch (filter_mode)
    {
        case RF_FILTER_POINT:
        {
            if (texture.mipmaps > 1)
            {
                // GL_NEAREST_MIPMAP_NEAREST - tex filter: POINT, mipmaps filter: POINT (sharp switching between mipmaps)
                rf_gl.TexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST_MIPMAP_NEAREST);

                // GL_NEAREST - tex filter: POINT (no filter), no mipmaps
                rf_gl.TexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
            }
            else
            {
                // GL_NEAREST - tex filter: POINT (no filter), no mipmaps
                rf_gl.TexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
                rf_gl.TexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
            }
        } break;

        case RF_FILTER_BILINEAR:
        {
            if (texture.mipmaps > 1)
            {
                // GL_LINEAR_MIPMAP_NEAREST - tex filter: BILINEAR, mipmaps filter: POINT (sharp switching between mipmaps)
                // Alternative: GL_NEAREST_MIPMAP_LINEAR - tex filter: POINT, mipmaps filter: BILINEAR (smooth transition between mipmaps)
                rf_gl.TexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR_MIPMAP_NEAREST);

                // GL_LINEAR - tex filter: BILINEAR, no mipmaps
                rf_gl.TexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
            }
            else
            {
                // GL_LINEAR - tex filter: BILINEAR, no mipmaps
                rf_gl.TexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
                rf_gl.TexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
            }
        } break;

        case RF_FILTER_TRILINEAR:
        {
            if (texture.mipmaps > 1)
            {
                // GL_LINEAR_MIPMAP_LINEAR - tex filter: BILINEAR, mipmaps filter: BILINEAR (smooth transition between mipmaps)
                rf_gl.TexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR_MIPMAP_LINEAR);

                // GL_LINEAR - tex filter: BILINEAR, no mipmaps
                rf_gl.TexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
            }
            else
            {
                RF_LOG(RF_LOG_TYPE_WARNING, "No mipmaps available for TRILINEAR texture filtering. Texture id: %d", texture.id);

                // GL_LINEAR - tex filter: BILINEAR, no mipmaps
                rf_gl.TexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
                rf_gl.TexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
            }
        } break;

        case RF_FILTER_ANISOTROPIC_4x:  anisotropic_value = 4;
        case RF_FILTER_ANISOTROPIC_8x:  anisotropic_value = 8;
        case RF_FILTER_ANISOTROPIC_16x: anisotropic_value = 16;
        {
            if (anisotropic_value <= rf_gfx.extensions.max_anisotropic_level)
            {
                rf_gl.TexParameterf(GL_TEXTURE_2D, GL_TEXTURE_MAX_ANISOTROPY_EXT, anisotropic_value);
            }
            else if (rf_gfx.extensions.max_anisotropic_level > 0.0f)
            {
                RF_LOG(RF_LOG_TYPE_WARNING, "Maximum anisotropic filter level supported is %i_x. Texture id: %d", rf_gfx.extensions.max_anisotropic_level, texture.id);
                rf_gl.TexParameterf(GL_TEXTURE_2D, GL_TEXTURE_MAX_ANISOTROPY_EXT, anisotropic_value);
            }
            else
            {
                RF_LOG(RF_LOG_TYPE_WARNING, "Anisotropic filtering not supported");
            }
        } break;
    }

    rf_gl.BindTexture(GL_TEXTURE_2D, 0);
}